

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

void fy_emit_token_write_plain(fy_emitter *emit,fy_token *fyt,int flags,int indent)

{
  _Bool _Var1;
  fy_atom_style fVar2;
  int iVar3;
  int iVar4;
  bool local_232;
  undefined1 local_231;
  undefined1 local_230 [8];
  fy_atom_iter iter;
  fy_atom *atom;
  size_t len;
  char *str;
  int local_28;
  fy_emitter_write_type wtype;
  int c;
  _Bool breaks;
  _Bool spaces;
  _Bool should_indent;
  _Bool allow_breaks;
  int indent_local;
  int flags_local;
  fy_token *fyt_local;
  fy_emitter *emit_local;
  
  len = 0;
  atom = (fy_atom *)0x0;
  c = indent;
  _breaks = flags;
  _indent_local = fyt;
  fyt_local = (fy_token *)emit;
  if ((fyt != (fy_token *)0x0) || (_Var1 = fy_emit_is_json_mode(emit), _Var1)) {
    str._4_4_ = fyewt_plain_scalar;
    if ((_breaks & 0x40) != 0) {
      str._4_4_ = fyewt_plain_scalar_key;
    }
    iter._480_8_ = fy_token_atom(_indent_local);
    _Var1 = fy_emit_is_json_mode((fy_emitter *)fyt_local);
    if ((_Var1) &&
       (((_indent_local == (fy_token *)0x0 || (iter._480_8_ == 0)) ||
        ((*(uint *)(iter._480_8_ + 0x34) >> 0x14 & 1) != 0)))) {
      fy_emit_puts((fy_emitter *)fyt_local,str._4_4_,"null");
    }
    else {
      len = (size_t)fy_token_get_direct_output(_indent_local,(size_t *)&atom);
      if (((char *)len == (char *)0x0) ||
         (fVar2 = fy_token_atom_style(_indent_local), fVar2 != FYAS_PLAIN)) {
        if (iter._480_8_ != 0) {
          local_231 = fyewt_document_indicator >> 0x18;
          if ((_breaks & 8) == 0) {
            _Var1 = fy_emit_is_json_mode((fy_emitter *)fyt_local);
            local_231 = fyewt_document_indicator >> 0x18;
            if (!_Var1) {
              _Var1 = fy_emit_is_oneline((fy_emitter *)fyt_local);
              local_231 = _Var1 ^ 0xff;
            }
          }
          wtype._3_1_ = local_231 & 1;
          wtype._1_1_ = fyewt_document_indicator >> 8;
          wtype._0_1_ = fyewt_document_indicator;
          fy_atom_iter_start((fy_atom *)iter._480_8_,(fy_atom_iter *)local_230);
          fy_emit_accum_start((fy_emit_accum *)&fyt_local->text0,str._4_4_);
          while (local_28 = fy_atom_iter_utf8_get((fy_atom_iter *)local_230), 0 < local_28) {
            _Var1 = fy_is_ws(local_28);
            if (_Var1) {
              local_232 = false;
              if (((wtype._3_1_ & 1) != fyewt_document_indicator >> 0x18) &&
                 (local_232 = false, (wtype._1_1_ & 1) == fyewt_document_indicator >> 8)) {
                iVar3 = fy_emit_accum_column((fy_emit_accum *)&fyt_local->text0);
                iVar4 = fy_emit_width((fy_emitter *)fyt_local);
                local_232 = iVar4 < iVar3;
              }
              wtype._2_1_ = local_232;
              if (local_232 == false) {
LAB_00136501:
                fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,local_28);
              }
              else {
                iVar3 = fy_atom_iter_utf8_peek((fy_atom_iter *)local_230);
                _Var1 = fy_is_ws(iVar3);
                if (_Var1) goto LAB_00136501;
                fy_emit_accum_output((fy_emit_accum *)&fyt_local->text0);
                *(uint *)((long)&(fyt_local->node).prev + 4) =
                     *(uint *)((long)&(fyt_local->node).prev + 4) & 0xfffffffd;
                fy_emit_write_indent((fy_emitter *)fyt_local,c);
              }
              wtype._1_1_ = 1;
            }
            else {
              _Var1 = fy_is_lb(local_28);
              if (_Var1) {
                if ((wtype._3_1_ & 1) == fyewt_document_indicator >> 0x18) break;
                if (((undefined1)wtype & fyewt_tag_directive) == fyewt_document_indicator) {
                  fy_emit_accum_output((fy_emit_accum *)&fyt_local->text0);
                  fy_emit_write_indent((fy_emitter *)fyt_local,c);
                }
                *(uint *)((long)&(fyt_local->node).prev + 4) =
                     *(uint *)((long)&(fyt_local->node).prev + 4) & 0xfffffffd;
                fy_emit_write_indent((fy_emitter *)fyt_local,c);
                wtype._0_1_ = fyewt_tag_directive;
              }
              else {
                if (((undefined1)wtype & fyewt_tag_directive) != fyewt_document_indicator) {
                  fy_emit_write_indent((fy_emitter *)fyt_local,c);
                }
                fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,local_28);
                *(uint *)((long)&(fyt_local->node).prev + 4) =
                     *(uint *)((long)&(fyt_local->node).prev + 4) & 0xfffffffd;
                wtype._1_1_ = fyewt_document_indicator >> 8;
                wtype._0_1_ = fyewt_document_indicator;
              }
            }
          }
          fy_emit_accum_output((fy_emit_accum *)&fyt_local->text0);
          fy_emit_accum_finish((fy_emit_accum *)&fyt_local->text0);
          fy_atom_iter_finish((fy_atom_iter *)local_230);
        }
      }
      else {
        fy_emit_write((fy_emitter *)fyt_local,str._4_4_,(char *)len,(int)atom);
      }
    }
  }
  *(uint *)((long)&(fyt_local->node).prev + 4) =
       *(uint *)((long)&(fyt_local->node).prev + 4) & 0xfffffffc;
  return;
}

Assistant:

void fy_emit_token_write_plain(struct fy_emitter *emit, struct fy_token *fyt, int flags, int indent) {
    bool allow_breaks, should_indent, spaces, breaks;
    int c;
    enum fy_emitter_write_type wtype;
    const char *str = NULL;
    size_t len = 0;
    struct fy_atom *atom;
    struct fy_atom_iter iter;

    /* null and not json mode */
    if (!fyt && !fy_emit_is_json_mode(emit))
        goto out;

    wtype = (flags & DDNF_SIMPLE_SCALAR_KEY) ? fyewt_plain_scalar_key : fyewt_plain_scalar;

    atom = fy_token_atom(fyt);

    /* null and json mode */
    if (fy_emit_is_json_mode(emit) && (!fyt || !atom || atom->size0)) {
        fy_emit_puts(emit, wtype, "null");
        goto out;
    }

    /* simple case first (90% of cases) */
    str = fy_token_get_direct_output(fyt, &len);
    if (str && fy_token_atom_style(fyt) == FYAS_PLAIN) {
        fy_emit_write(emit, wtype, str, len);
        goto out;
    }

    if (!atom)
        goto out;

    allow_breaks = !(flags & DDNF_SIMPLE) && !fy_emit_is_json_mode(emit) && !fy_emit_is_oneline(emit);

    spaces = false;
    breaks = false;

    fy_atom_iter_start(atom, &iter);
    fy_emit_accum_start(&emit->ea, wtype);
    while ((c = fy_atom_iter_utf8_get(&iter)) > 0) {

        if (fy_is_ws(c)) {

            should_indent = allow_breaks && !spaces &&
                            fy_emit_accum_column(&emit->ea) > fy_emit_width(emit);

            if (should_indent && !fy_is_ws(fy_atom_iter_utf8_peek(&iter))) {
                fy_emit_accum_output(&emit->ea);
                emit->flags &= ~FYEF_INDENTATION;
                fy_emit_write_indent(emit, indent);
            } else
                fy_emit_accum_utf8_put(&emit->ea, c);

            spaces = true;

        } else if (fy_is_lb(c)) {

            /* blergh */
            if (!allow_breaks)
                break;

            /* output run */
            if (!breaks) {
                fy_emit_accum_output(&emit->ea);
                fy_emit_write_indent(emit, indent);
            }

            emit->flags &= ~FYEF_INDENTATION;
            fy_emit_write_indent(emit, indent);

            breaks = true;

        } else {

            if (breaks)
                fy_emit_write_indent(emit, indent);

            fy_emit_accum_utf8_put(&emit->ea, c);

            emit->flags &= ~FYEF_INDENTATION;

            spaces = false;
            breaks = false;
        }
    }
    fy_emit_accum_output(&emit->ea);
    fy_emit_accum_finish(&emit->ea);
    fy_atom_iter_finish(&iter);

    out:
    emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION);
}